

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::CreateDstUntransferredIntValue
          (GlobOpt *this,int32 min,int32 max,Instr *instr,Value *src1Value,Value *src2Value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  ValueInfo *pVVar5;
  RegOpnd *pRVar6;
  IntConstantBounds local_64;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  Opnd *local_58;
  Opnd *dst;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  byte local_45;
  bool isValueInfoPrecise;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  Value *pVStack_38;
  ValueType valueType;
  Value *src2Value_local;
  Value *src1Value_local;
  Instr *instr_local;
  int32 max_local;
  int32 min_local;
  GlobOpt *this_local;
  
  pVStack_38 = src2Value;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1689,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x168a,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = OpCodeAttr::ProducesNumber(instr->m_opcode);
  if (!bVar2) {
    if (instr->m_opcode == Add_A) {
      pVVar5 = ::Value::GetValueInfo(src1Value);
      bVar2 = ValueType::IsNumber(&pVVar5->super_ValueType);
      if (bVar2) {
        pVVar5 = ::Value::GetValueInfo(pVStack_38);
        bVar2 = ValueType::IsNumber(&pVVar5->super_ValueType);
        if (bVar2) goto LAB_00592d89;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x168e,
                       "(OpCodeAttr::ProducesNumber(instr->m_opcode) || (instr->m_opcode == Js::OpCode::Add_A && src1Value->GetValueInfo()->IsNumber() && src2Value->GetValueInfo()->IsNumber()))"
                       ,
                       "OpCodeAttr::ProducesNumber(instr->m_opcode) || (instr->m_opcode == Js::OpCode::Add_A && src1Value->GetValueInfo()->IsNumber() && src2Value->GetValueInfo()->IsNumber())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
LAB_00592d89:
  IntConstantBounds::IntConstantBounds((IntConstantBounds *)&stack0xffffffffffffffbc,min,max);
  bVar2 = IntConstantBounds::IsLikelyTaggable((IntConstantBounds *)&stack0xffffffffffffffbc);
  local_3a.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetInt(bVar2);
  bVar2 = ValueType::IsInt((ValueType *)&local_3a.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1691,"(valueType.IsInt())","valueType.IsInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    local_45 = IsPrepassSrcValueInfoPrecise(this,instr,src1Value,pVStack_38,(bool *)0x0);
    dst._6_2_ = local_3a.field_0;
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetPrepassValueTypeForDst
                   (this,local_3a.field_0,instr,src1Value,pVStack_38,(bool)local_45,false);
    local_3a.field_0 = local_48.field_0;
  }
  else {
    local_45 = 1;
  }
  local_58 = IR::Instr::GetDst(instr);
  if ((local_45 & 1) == 0) {
    this_local = (GlobOpt *)NewGenericValue(this,(ValueType)local_3a.field_0,local_58);
  }
  else {
    IntConstantBounds::IntConstantBounds(&local_64,min,max);
    bVar2 = IntConstantBounds::IsLikelyTaggable(&local_64);
    local_5a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(bVar2);
    bVar2 = ValueType::operator==((ValueType *)&local_3a.field_0,(ValueType)local_5a);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x16a0,
                         "(valueType == ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable()))"
                         ,
                         "valueType == ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable())"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = IR::Opnd::IsRegOpnd(local_58);
    if (bVar2) {
      pRVar6 = IR::Opnd::AsRegOpnd(local_58);
      bVar2 = StackSym::IsTypeSpec(pRVar6->m_sym);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x16a1,"(!(dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsTypeSpec()))",
                           "!(dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsTypeSpec())");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
    this_local = (GlobOpt *)NewIntRangeValue(this,min,max,false,local_58);
  }
  return (Value *)this_local;
}

Assistant:

Value *GlobOpt::CreateDstUntransferredIntValue(
    const int32 min,
    const int32 max,
    IR::Instr *const instr,
    Value *const src1Value,
    Value *const src2Value)
{
    Assert(instr);
    Assert(instr->GetDst());

    Assert(OpCodeAttr::ProducesNumber(instr->m_opcode)
        || (instr->m_opcode == Js::OpCode::Add_A && src1Value->GetValueInfo()->IsNumber()
        && src2Value->GetValueInfo()->IsNumber()));

    ValueType valueType(ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable()));
    Assert(valueType.IsInt());
    bool isValueInfoPrecise;
    if(IsLoopPrePass())
    {
        isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value);
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, isValueInfoPrecise);
    }
    else
    {
        isValueInfoPrecise = true;
    }

    IR::Opnd *const dst = instr->GetDst();
    if(isValueInfoPrecise)
    {
        Assert(valueType == ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable()));
        Assert(!(dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsTypeSpec()));
        return NewIntRangeValue(min, max, false, dst);
    }
    return NewGenericValue(valueType, dst);
}